

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_sched_split_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  int iVar1;
  ggml_init_params params_00;
  _Bool _Var2;
  int iVar3;
  ggml_context *pgVar4;
  size_t sVar5;
  void *pvVar6;
  char *pcVar7;
  ggml_tensor *pgVar8;
  int *piVar9;
  size_t sVar10;
  long in_RSI;
  undefined1 *in_RDI;
  ggml_tensor *leaf_1;
  int i_12;
  ggml_tensor *input_cpy_2;
  int c_3;
  size_t id_2;
  ggml_tensor *input_2;
  int j_7;
  int backend_id_1;
  ggml_backend_sched_split *split_2;
  int i_11;
  ggml_tensor *input_cpy_1;
  int c_2;
  int backend_id;
  size_t id_1;
  ggml_tensor *input_1;
  int i_10;
  int j_6;
  ggml_tensor *input_dep;
  ggml_tensor *input_cpy;
  size_t input_id;
  ggml_tensor *input;
  int j_5;
  ggml_backend_sched_split *split_1;
  int i_9;
  ggml_cgraph *graph_copy;
  int graph_size;
  int *tmp;
  int n_inputs;
  ggml_tensor *tensor_copy_1;
  int c_1;
  ggml_backend_t backend_1;
  int n_graph_inputs;
  ggml_tensor *tensor_copy;
  int c;
  ggml_backend_t backend;
  int src_backend_id_3;
  size_t src_id;
  ggml_tensor *src_4;
  int j_4;
  _Bool supported_1;
  int src_backend_id_2;
  size_t id;
  int src_backend_id_1;
  ggml_tensor *src_3;
  int j_3;
  _Bool need_new_split;
  int node_backend_id_6;
  ggml_tensor *node_8;
  int cur_backend_id_5;
  ggml_tensor *node_7;
  int i_8;
  ggml_backend_sched_split *split;
  int i_split;
  int *src_backend_id;
  ggml_tensor *src_2;
  int j_2;
  int *cur_backend_id_4;
  ggml_tensor *node_6;
  int i_7;
  ggml_tensor *src_1;
  int j_1;
  _Bool supported;
  int b_1;
  ggml_tensor *src;
  int j;
  int n_supported;
  int b;
  int n_supported_best;
  int *node_backend_id_5;
  ggml_tensor *node_5;
  int i_6;
  int *node_backend_id_4;
  ggml_tensor *node_4;
  int i_5;
  int cur_backend_id_3;
  int *node_backend_id_3;
  ggml_tensor *node_3;
  int i_4;
  int cur_backend_id_2;
  int *node_backend_id_2;
  ggml_tensor *node_2;
  int i_3;
  int cur_backend_id_1;
  int *node_backend_id_1;
  ggml_tensor *node_1;
  int i_2;
  int cur_backend_id;
  int *node_backend_id;
  ggml_tensor *node;
  int i_1;
  int *leaf_backend_id;
  ggml_tensor *leaf;
  int i;
  ggml_init_params params;
  ggml_tensor *pgVar11;
  ggml_tensor *key;
  ggml_tensor *src_00;
  ggml_backend_sched_t in_stack_fffffffffffffc40;
  long lVar12;
  ggml_tensor *in_stack_fffffffffffffc60;
  ggml_backend_sched_t in_stack_fffffffffffffc68;
  ggml_backend_sched_t in_stack_fffffffffffffc70;
  ggml_backend_sched_t sched_00;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  ggml_cgraph *in_stack_fffffffffffffcc8;
  ggml_backend_sched_t in_stack_fffffffffffffcd0;
  undefined8 uVar13;
  int iVar14;
  int local_2e8;
  int local_2d4;
  int local_2c8;
  int local_2b0;
  int local_2ac;
  int local_284;
  undefined1 local_280 [80];
  int *local_230;
  int local_224;
  undefined1 *local_220;
  int local_214;
  undefined8 local_210;
  int local_204;
  ggml_tensor *local_200;
  uint local_1f4;
  undefined8 local_1f0;
  int local_1e4;
  ggml_tensor *local_1e0;
  uint local_1d4;
  undefined8 local_1d0;
  int local_1c4;
  size_t local_1c0;
  ggml_tensor *local_1b8;
  int local_1ac;
  undefined1 local_1a5;
  int local_1a4;
  size_t local_1a0;
  int local_194;
  long local_190;
  int local_184;
  byte local_17d;
  int local_17c;
  long local_178;
  int local_16c;
  long local_168;
  int local_15c;
  int *local_158;
  int local_14c;
  int *local_148;
  long local_140;
  int local_134;
  int *local_130;
  long local_128;
  int local_11c;
  long local_118;
  int local_10c;
  byte local_105;
  int local_104;
  long local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int *local_e8;
  long local_e0;
  int local_d4;
  int *local_d0;
  long local_c8;
  int local_c0;
  int local_bc;
  int *local_b8;
  long local_b0;
  int local_a8;
  int local_a4;
  int *local_a0;
  long local_98;
  int local_90;
  int local_8c;
  int *local_88;
  long local_80;
  int local_78;
  int local_74;
  int *local_70;
  undefined8 local_68;
  int local_5c;
  int *local_58;
  undefined8 local_50;
  int local_44;
  ggml_tensor *local_40;
  ggml_tensor *local_38;
  ggml_tensor *local_30;
  ggml_tensor *local_28;
  ggml_tensor *local_20;
  undefined1 local_18;
  undefined7 uStack_17;
  long local_10;
  undefined1 *local_8;
  
  *(undefined4 *)(in_RDI + 0x1b0) = 0;
  *(undefined4 *)(in_RDI + 0x410) = 0;
  *in_RDI = 0;
  local_28 = *(ggml_tensor **)(in_RDI + 0x438);
  local_20 = *(ggml_tensor **)(in_RDI + 0x430);
  local_18 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ggml_free((ggml_context *)0x15fb60);
  local_40 = local_28;
  local_38 = local_20;
  src_00 = (ggml_tensor *)CONCAT71(uStack_17,local_18);
  params_00.mem_buffer = (void *)in_stack_fffffffffffffc98;
  params_00.mem_size = in_stack_fffffffffffffc90;
  params_00._16_8_ = in_stack_fffffffffffffca0;
  pgVar11 = local_28;
  key = local_20;
  local_30 = src_00;
  pgVar4 = ggml_init(params_00);
  *(ggml_context **)(local_8 + 0x418) = pgVar4;
  if (*(long *)(local_8 + 0x418) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
               ,0x36f,"%s: failed to initialize context\n","ggml_backend_sched_split_graph");
  }
  for (local_44 = 0; local_44 < *(int *)(local_10 + 8); local_44 = local_44 + 1) {
    local_50 = *(undefined8 *)(*(long *)(local_10 + 0x28) + (long)local_44 * 8);
    lVar12 = *(long *)(local_8 + 0x128);
    sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
    local_58 = (int *)(lVar12 + sVar5 * 4);
    if (*local_58 == -1) {
      iVar3 = ggml_backend_sched_backend_id_from_cur
                        (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      *local_58 = iVar3;
    }
  }
  for (local_5c = 0; local_5c < *(int *)(local_10 + 4); local_5c = local_5c + 1) {
    local_68 = *(undefined8 *)(*(long *)(local_10 + 0x10) + (long)local_5c * 8);
    lVar12 = *(long *)(local_8 + 0x128);
    sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
    local_70 = (int *)(lVar12 + sVar5 * 4);
    if (*local_70 == -1) {
      iVar3 = ggml_backend_sched_backend_id_from_cur
                        (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      *local_70 = iVar3;
    }
  }
  local_74 = -1;
  for (local_78 = 0; local_78 < *(int *)(local_10 + 4); local_78 = local_78 + 1) {
    local_80 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_78 * 8);
    _Var2 = ggml_is_view_op(*(ggml_op *)(local_80 + 0x50));
    if (!_Var2) {
      in_stack_fffffffffffffcd0 = *(ggml_backend_sched_t *)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      local_88 = (int *)((long)in_stack_fffffffffffffcd0->backends + sVar5 * 4 + -8);
      if (*local_88 == -1) {
        if (local_74 != -1) {
          ggml_backend_sched_set_if_supported
                    (in_stack_fffffffffffffc40,src_00,(int)((ulong)key >> 0x20),(int *)pgVar11);
        }
      }
      else if (*local_88 == *(int *)(local_8 + 4) + -1) {
        local_74 = -1;
      }
      else {
        local_74 = *local_88;
      }
    }
  }
  local_8c = -1;
  local_90 = *(int *)(local_10 + 4);
  while (local_90 = local_90 + -1, -1 < local_90) {
    local_98 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_90 * 8);
    _Var2 = ggml_is_view_op(*(ggml_op *)(local_98 + 0x50));
    if (!_Var2) {
      in_stack_fffffffffffffcc8 = *(ggml_cgraph **)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      local_a0 = &in_stack_fffffffffffffcc8->size + sVar5;
      if (*local_a0 == -1) {
        if (local_8c != -1) {
          ggml_backend_sched_set_if_supported
                    (in_stack_fffffffffffffc40,src_00,(int)((ulong)key >> 0x20),(int *)pgVar11);
        }
      }
      else if (*local_a0 == *(int *)(local_8 + 4) + -1) {
        local_8c = -1;
      }
      else {
        local_8c = *local_a0;
      }
    }
  }
  local_a4 = -1;
  for (local_a8 = 0; local_a8 < *(int *)(local_10 + 4); local_a8 = local_a8 + 1) {
    local_b0 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_a8 * 8);
    _Var2 = ggml_is_view_op(*(ggml_op *)(local_b0 + 0x50));
    if (!_Var2) {
      lVar12 = *(long *)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      local_b8 = (int *)(lVar12 + sVar5 * 4);
      if (*local_b8 == -1) {
        if (local_a4 != -1) {
          ggml_backend_sched_set_if_supported
                    (in_stack_fffffffffffffc40,src_00,(int)((ulong)key >> 0x20),(int *)pgVar11);
        }
      }
      else {
        local_a4 = *local_b8;
      }
    }
  }
  local_bc = -1;
  local_c0 = *(int *)(local_10 + 4);
  while (local_c0 = local_c0 + -1, -1 < local_c0) {
    local_c8 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_c0 * 8);
    _Var2 = ggml_is_view_op(*(ggml_op *)(local_c8 + 0x50));
    if (!_Var2) {
      lVar12 = *(long *)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      local_d0 = (int *)(lVar12 + sVar5 * 4);
      if (*local_d0 == -1) {
        if (local_bc != -1) {
          ggml_backend_sched_set_if_supported
                    (in_stack_fffffffffffffc40,src_00,(int)((ulong)key >> 0x20),(int *)pgVar11);
        }
      }
      else {
        local_bc = *local_d0;
      }
    }
  }
  for (local_d4 = 0; local_d4 < *(int *)(local_10 + 4); local_d4 = local_d4 + 1) {
    local_e0 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_d4 * 8);
    _Var2 = ggml_is_view_op(*(ggml_op *)(local_e0 + 0x50));
    if (!_Var2) {
      lVar12 = *(long *)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      local_e8 = (int *)(lVar12 + sVar5 * 4);
      if (*local_e8 == -1) {
        local_ec = -1;
        for (local_f0 = 0; local_f0 < *(int *)(local_8 + 4); local_f0 = local_f0 + 1) {
          _Var2 = ggml_backend_supports_op((ggml_backend_t)key,pgVar11);
          if (_Var2) {
            local_f4 = 0;
            for (local_f8 = 0; local_f8 < 10; local_f8 = local_f8 + 1) {
              local_100 = *(long *)(local_e0 + 0x98 + (long)local_f8 * 8);
              if (local_100 != 0) {
                lVar12 = *(long *)(local_8 + 0x128);
                sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
                if (*(int *)(lVar12 + sVar5 * 4) == -1) {
                  lVar12 = *(long *)(local_8 + 0x128);
                  sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
                  if (*(int *)(lVar12 + sVar5 * 4) == -1) goto LAB_00160498;
                }
                _Var2 = ggml_backend_sched_buffer_supported
                                  (in_stack_fffffffffffffc70,
                                   (ggml_tensor *)in_stack_fffffffffffffc68,
                                   (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                if (_Var2) {
                  local_f4 = local_f4 + 1;
                }
              }
LAB_00160498:
            }
            if (local_ec < local_f4) {
              local_ec = local_f4;
              *local_e8 = local_f0;
            }
          }
        }
      }
      else {
        for (local_104 = 0; local_104 < *local_e8; local_104 = local_104 + 1) {
          if ((*(long *)(local_8 + (long)local_104 * 8 + 0x88) ==
               *(long *)(local_8 + (long)*local_e8 * 8 + 0x88)) &&
             (_Var2 = ggml_backend_supports_op((ggml_backend_t)key,pgVar11), _Var2)) {
            local_105 = 1;
            for (local_10c = 0; local_10c < 10; local_10c = local_10c + 1) {
              local_118 = *(long *)(local_e0 + 0x98 + (long)local_10c * 8);
              if ((local_118 != 0) &&
                 (_Var2 = ggml_backend_sched_buffer_supported
                                    (in_stack_fffffffffffffc70,
                                     (ggml_tensor *)in_stack_fffffffffffffc68,
                                     (int)((ulong)in_stack_fffffffffffffc60 >> 0x20)), !_Var2)) {
                local_105 = 0;
                break;
              }
            }
            if ((local_105 & 1) != 0) {
              *local_e8 = local_104;
              break;
            }
          }
        }
      }
    }
  }
  for (local_11c = 0; local_11c < *(int *)(local_10 + 4); local_11c = local_11c + 1) {
    local_128 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_11c * 8);
    lVar12 = *(long *)(local_8 + 0x128);
    sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
    local_130 = (int *)(lVar12 + sVar5 * 4);
    if ((*(long *)(local_128 + 0xe8) != 0) && (*local_130 == -1)) {
      lVar12 = *(long *)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      *local_130 = *(int *)(lVar12 + sVar5 * 4);
    }
    for (local_134 = 0; local_134 < 10; local_134 = local_134 + 1) {
      local_140 = *(long *)(local_128 + 0x98 + (long)local_134 * 8);
      if (local_140 != 0) {
        lVar12 = *(long *)(local_8 + 0x128);
        sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
        local_148 = (int *)(lVar12 + sVar5 * 4);
        if (*local_148 == -1) {
          if (*(long *)(local_140 + 0xe8) == 0) {
            *local_148 = *local_130;
          }
          else {
            lVar12 = *(long *)(local_8 + 0x128);
            sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
            *local_148 = *(int *)(lVar12 + sVar5 * 4);
          }
        }
      }
    }
  }
  local_14c = 0;
  local_158 = *(int **)(local_8 + 0x1a8);
  local_15c = 0;
  do {
    if (*(int *)(local_10 + 4) <= local_15c) {
LAB_0016096c:
      local_158[1] = 0;
      local_158[0x18] = 0;
      local_16c = *local_158;
      do {
        if (*(int *)(local_10 + 4) <= local_15c) {
          local_158[2] = *(int *)(local_10 + 4);
          *(int *)(local_8 + 0x1b0) = local_14c + 1;
          if (*(int *)(local_8 + 0x440) != 0) {
            ggml_backend_sched_print_assignments
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          }
          uVar13 = *(undefined8 *)(local_8 + 0x138);
          *(undefined8 *)(local_8 + 0x138) = *(undefined8 *)(local_8 + 0x148);
          *(undefined8 *)(local_8 + 0x148) = uVar13;
          local_210 = *(undefined8 *)(local_8 + 0x140);
          *(undefined8 *)(local_8 + 0x140) = *(undefined8 *)(local_8 + 0x150);
          *(undefined8 *)(local_8 + 0x150) = local_210;
          piVar9 = std::max<int>((int *)(local_10 + 4),(int *)(local_10 + 8));
          local_214 = *piVar9 + *(int *)(local_8 + 0x1b0) * 0x14 * *(int *)(local_8 + 0x1b8);
          if (*(int *)(local_8 + 0x158) < local_214) {
            *(int *)(local_8 + 0x158) = local_214;
            pvVar6 = realloc(*(void **)(local_8 + 0x168),(long)local_214 << 3);
            *(void **)(local_8 + 0x168) = pvVar6;
            pvVar6 = realloc(*(void **)(local_8 + 0x180),(long)local_214 << 3);
            *(void **)(local_8 + 0x180) = pvVar6;
            if (*(long *)(local_8 + 0x168) == 0) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                         ,0x4da,"GGML_ASSERT(%s) failed","sched->graph.nodes != NULL");
            }
            if (*(long *)(local_8 + 0x180) == 0) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                         ,0x4db,"GGML_ASSERT(%s) failed","sched->graph.leafs != NULL");
            }
          }
          *(undefined4 *)(local_8 + 0x15c) = 0;
          *(undefined4 *)(local_8 + 0x160) = 0;
          local_220 = local_8 + 0x158;
          for (local_224 = 0; local_224 < *(int *)(local_8 + 0x1b0); local_224 = local_224 + 1) {
            local_230 = (int *)(*(long *)(local_8 + 0x1a8) + (long)local_224 * 0xb8);
            ggml_graph_view((ggml_cgraph *)in_stack_fffffffffffffc40,(int)((ulong)src_00 >> 0x20),
                            (int)src_00);
            memcpy(local_230 + 0x1a,local_280,0x50);
            for (local_284 = 0; local_284 < local_230[0x18]; local_284 = local_284 + 1) {
              pgVar11 = *(ggml_tensor **)(local_230 + (long)local_284 * 2 + 4);
              sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
              uVar13 = *(undefined8 *)
                        (*(long *)(local_8 + 0x130) +
                        (sVar5 * (long)*(int *)(local_8 + 4) * (long)*(int *)(local_8 + 0x1b8) +
                         (long)(*local_230 * *(int *)(local_8 + 0x1b8)) +
                        (long)*(int *)(local_8 + 0x1bc)) * 8);
              pgVar8 = ggml_view_tensor((ggml_context *)in_stack_fffffffffffffc40,src_00);
              pgVar8->src[0] = pgVar11;
              *(undefined4 *)(*(long *)(local_8 + 0x138) + (long)*(int *)(local_220 + 4) * 4) =
                   *(undefined4 *)(*(long *)(local_8 + 0x128) + sVar5 * 4);
              iVar3 = *(int *)(local_220 + 4);
              *(int *)(local_220 + 4) = iVar3 + 1;
              *(ggml_tensor **)(*(long *)(local_220 + 0x10) + (long)iVar3 * 8) = pgVar8;
              *(int *)(*(long *)(local_8 + 0x138) + (long)*(int *)(local_220 + 4) * 4) = *local_230;
              iVar3 = *(int *)(local_220 + 4);
              *(int *)(local_220 + 4) = iVar3 + 1;
              *(undefined8 *)(*(long *)(local_220 + 0x10) + (long)iVar3 * 8) = uVar13;
            }
            for (local_2ac = local_230[1]; local_2ac < local_230[2]; local_2ac = local_2ac + 1) {
              lVar12 = *(long *)(local_8 + 0x128);
              sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
              *(undefined4 *)(*(long *)(local_8 + 0x138) + (long)*(int *)(local_220 + 4) * 4) =
                   *(undefined4 *)(lVar12 + sVar5 * 4);
              uVar13 = *(undefined8 *)(*(long *)(local_10 + 0x10) + (long)local_2ac * 8);
              iVar3 = *(int *)(local_220 + 4);
              *(int *)(local_220 + 4) = iVar3 + 1;
              *(undefined8 *)(*(long *)(local_220 + 0x10) + (long)iVar3 * 8) = uVar13;
            }
          }
          if (1 < *(int *)(local_8 + 0x1b8)) {
            for (local_2b0 = 0; local_2b0 < *(int *)(local_8 + 0x410); local_2b0 = local_2b0 + 1) {
              sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
              lVar12 = *(long *)(local_8 + 0x128);
              sVar10 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
              iVar3 = *(int *)(lVar12 + sVar10 * 4);
              for (local_2c8 = 0; local_2c8 < *(int *)(local_8 + 0x1b8); local_2c8 = local_2c8 + 1)
              {
                uVar13 = *(undefined8 *)
                          (*(long *)(local_8 + 0x130) +
                          (sVar5 * (long)*(int *)(local_8 + 4) * (long)*(int *)(local_8 + 0x1b8) +
                           (long)(iVar3 * *(int *)(local_8 + 0x1b8)) + (long)local_2c8) * 8);
                *(int *)(*(long *)(local_8 + 0x140) + (long)*(int *)(local_220 + 8) * 4) = iVar3;
                iVar14 = *(int *)(local_220 + 8);
                *(int *)(local_220 + 8) = iVar14 + 1;
                *(undefined8 *)(*(long *)(local_220 + 0x28) + (long)iVar14 * 8) = uVar13;
              }
            }
            for (local_2d4 = 0; local_2d4 < *(int *)(local_8 + 0x1b0); local_2d4 = local_2d4 + 1) {
              piVar9 = (int *)(*(long *)(local_8 + 0x1a8) + (long)local_2d4 * 0xb8);
              iVar3 = *piVar9;
              for (local_2e8 = 0; local_2e8 < piVar9[0x18]; local_2e8 = local_2e8 + 1) {
                sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
                for (iVar14 = 0; iVar14 < *(int *)(local_8 + 0x1b8); iVar14 = iVar14 + 1) {
                  uVar13 = *(undefined8 *)
                            (*(long *)(local_8 + 0x130) +
                            (sVar5 * (long)*(int *)(local_8 + 4) * (long)*(int *)(local_8 + 0x1b8) +
                             (long)(iVar3 * *(int *)(local_8 + 0x1b8)) + (long)iVar14) * 8);
                  *(int *)(*(long *)(local_8 + 0x140) + (long)*(int *)(local_220 + 8) * 4) = iVar3;
                  iVar1 = *(int *)(local_220 + 8);
                  *(int *)(local_220 + 8) = iVar1 + 1;
                  *(undefined8 *)(*(long *)(local_220 + 0x28) + (long)iVar1 * 8) = uVar13;
                }
              }
            }
          }
          for (iVar3 = 0; iVar3 < *(int *)(local_10 + 8); iVar3 = iVar3 + 1) {
            uVar13 = *(undefined8 *)(*(long *)(local_10 + 0x28) + (long)iVar3 * 8);
            lVar12 = *(long *)(local_8 + 0x128);
            sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
            *(undefined4 *)(*(long *)(local_8 + 0x140) + (long)*(int *)(local_220 + 8) * 4) =
                 *(undefined4 *)(lVar12 + sVar5 * 4);
            iVar14 = *(int *)(local_220 + 8);
            *(int *)(local_220 + 8) = iVar14 + 1;
            *(undefined8 *)(*(long *)(local_220 + 0x28) + (long)iVar14 * 8) = uVar13;
          }
          return;
        }
        local_178 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_15c * 8);
        _Var2 = ggml_is_view_op(*(ggml_op *)(local_178 + 0x50));
        if (!_Var2) {
          sched_00 = *(ggml_backend_sched_t *)(local_8 + 0x128);
          sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
          local_17c = *(int *)((long)sched_00->backends + sVar5 * 4 + -8);
          local_17d = 0;
          if ((local_17c == local_16c) && (0 < local_158[0x18])) {
            for (local_184 = 0; local_184 < 10; local_184 = local_184 + 1) {
              local_190 = *(long *)(local_178 + 0x98 + (long)local_184 * 8);
              if (local_190 != 0) {
                if ((*(long *)(local_190 + 8) != 0) &&
                   (*(int *)(*(long *)(local_190 + 8) + 0x60) == 1)) {
                  in_stack_fffffffffffffc68 = *(ggml_backend_sched_t *)(local_8 + 0x128);
                  sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
                  local_194 = *(int *)((long)in_stack_fffffffffffffc68->backends + sVar5 * 4 + -8);
                  if ((local_194 != local_16c) &&
                     (_Var2 = ggml_backend_sched_buffer_supported
                                        (sched_00,(ggml_tensor *)in_stack_fffffffffffffc68,
                                         (int)((ulong)in_stack_fffffffffffffc60 >> 0x20)), !_Var2))
                  {
                    local_17d = 1;
                    break;
                  }
                }
                if (local_158[0x18] == 10) {
                  local_1a0 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
                  local_1a4 = *(int *)(*(long *)(local_8 + 0x128) + local_1a0 * 4);
                  local_1a5 = ggml_backend_sched_buffer_supported
                                        (sched_00,(ggml_tensor *)in_stack_fffffffffffffc68,
                                         (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                  if (((local_1a4 != local_16c) &&
                      (*(long *)(*(long *)(local_8 + 0x130) +
                                (local_1a0 * (long)*(int *)(local_8 + 4) *
                                 (long)*(int *)(local_8 + 0x1b8) +
                                (long)(local_16c * *(int *)(local_8 + 0x1b8))) * 8) == 0)) &&
                     (!(bool)local_1a5)) {
                    local_17d = 1;
                    break;
                  }
                }
              }
            }
          }
          if ((local_17c != local_16c) || ((local_17d & 1) != 0)) {
            local_158[2] = local_15c;
            local_14c = local_14c + 1;
            if (*(int *)(local_8 + 0x1b4) <= local_14c) {
              *(int *)(local_8 + 0x1b4) = *(int *)(local_8 + 0x1b4) << 1;
              pvVar6 = realloc(*(void **)(local_8 + 0x1a8),(long)*(int *)(local_8 + 0x1b4) * 0xb8);
              *(void **)(local_8 + 0x1a8) = pvVar6;
              if (*(long *)(local_8 + 0x1a8) == 0) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                           ,0x480,"GGML_ASSERT(%s) failed","sched->splits != NULL");
              }
            }
            local_158 = (int *)(*(long *)(local_8 + 0x1a8) + (long)local_14c * 0xb8);
            *local_158 = local_17c;
            local_158[1] = local_15c;
            local_158[0x18] = 0;
            local_16c = local_17c;
          }
          for (local_1ac = 0; local_1ac < 10; local_1ac = local_1ac + 1) {
            local_1b8 = *(ggml_tensor **)(local_178 + 0x98 + (long)local_1ac * 8);
            if (local_1b8 != (ggml_tensor *)0x0) {
              local_1c0 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
              local_1c4 = *(int *)(*(long *)(local_8 + 0x128) + local_1c0 * 4);
              if ((((local_1b8->flags & 1U) != 0) && (1 < *(int *)(local_8 + 0x1b8))) &&
                 (*(long *)(*(long *)(local_8 + 0x130) +
                           (local_1c0 * (long)*(int *)(local_8 + 4) *
                            (long)*(int *)(local_8 + 0x1b8) +
                           (long)(local_1c4 * *(int *)(local_8 + 0x1b8))) * 8) == 0)) {
                local_1d0 = *(undefined8 *)(local_8 + (long)local_1c4 * 8 + 8);
                for (local_1d4 = 0; (int)local_1d4 < *(int *)(local_8 + 0x1b8);
                    local_1d4 = local_1d4 + 1) {
                  if (local_1d4 == *(uint *)(local_8 + 0x1bc)) {
                    local_1e0 = local_1b8;
                  }
                  else {
                    in_stack_fffffffffffffc60 =
                         ggml_dup_tensor_layout((ggml_context *)in_stack_fffffffffffffc40,src_00);
                    local_1e0 = in_stack_fffffffffffffc60;
                    pcVar7 = ggml_backend_name((ggml_backend_t)pgVar11);
                    ggml_format_name(in_stack_fffffffffffffc60,"%s#%s#%d",pcVar7,local_1b8->name,
                                     (ulong)local_1d4);
                  }
                  if (1 < *(int *)(local_8 + 0x1b8)) {
                    ggml_set_input(local_1e0);
                    ggml_set_output(local_1e0);
                  }
                  *(ggml_tensor **)
                   (*(long *)(local_8 + 0x130) +
                   (local_1c0 * (long)*(int *)(local_8 + 4) * (long)*(int *)(local_8 + 0x1b8) +
                    (long)(local_1c4 * *(int *)(local_8 + 0x1b8)) + (long)(int)local_1d4) * 8) =
                       local_1e0;
                }
                local_1e4 = *(int *)(local_8 + 0x410);
                *(int *)(local_8 + 0x410) = local_1e4 + 1;
                if (9 < local_1e4) {
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                             ,0x4a7,"GGML_ASSERT(%s) failed",
                             "n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS");
                }
                *(ggml_tensor **)(local_8 + (long)local_1e4 * 8 + 0x3c0) = local_1b8;
              }
              if ((local_1c4 != local_16c) &&
                 (_Var2 = ggml_backend_sched_buffer_supported
                                    (sched_00,(ggml_tensor *)in_stack_fffffffffffffc68,
                                     (int)((ulong)in_stack_fffffffffffffc60 >> 0x20)), !_Var2)) {
                if (*(long *)(*(long *)(local_8 + 0x130) +
                             (local_1c0 * (long)*(int *)(local_8 + 4) *
                              (long)*(int *)(local_8 + 0x1b8) +
                             (long)(local_16c * *(int *)(local_8 + 0x1b8))) * 8) == 0) {
                  local_1f0 = *(undefined8 *)(local_8 + (long)local_16c * 8 + 8);
                  for (local_1f4 = 0; (int)local_1f4 < *(int *)(local_8 + 0x1b8);
                      local_1f4 = local_1f4 + 1) {
                    pgVar8 = ggml_dup_tensor_layout
                                       ((ggml_context *)in_stack_fffffffffffffc40,src_00);
                    local_200 = pgVar8;
                    pcVar7 = ggml_backend_name((ggml_backend_t)pgVar11);
                    ggml_format_name(pgVar8,"%s#%s#%d",pcVar7,local_1b8->name,(ulong)local_1f4);
                    if (1 < *(int *)(local_8 + 0x1b8)) {
                      ggml_set_input(local_200);
                      ggml_set_output(local_200);
                    }
                    *(ggml_tensor **)
                     (*(long *)(local_8 + 0x130) +
                     (local_1c0 * (long)*(int *)(local_8 + 4) * (long)*(int *)(local_8 + 0x1b8) +
                      (long)(local_16c * *(int *)(local_8 + 0x1b8)) + (long)(int)local_1f4) * 8) =
                         local_200;
                  }
                  local_204 = local_158[0x18];
                  local_158[0x18] = local_204 + 1;
                  if (9 < local_204) {
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                               ,0x4bb,"GGML_ASSERT(%s) failed",
                               "n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS");
                  }
                  *(ggml_tensor **)(local_158 + (long)local_204 * 2 + 4) = local_1b8;
                }
                *(undefined8 *)(local_178 + 0x98 + (long)local_1ac * 8) =
                     *(undefined8 *)
                      (*(long *)(local_8 + 0x130) +
                      (local_1c0 * (long)*(int *)(local_8 + 4) * (long)*(int *)(local_8 + 0x1b8) +
                       (long)(local_16c * *(int *)(local_8 + 0x1b8)) +
                      (long)*(int *)(local_8 + 0x1bc)) * 8);
              }
            }
          }
        }
        local_15c = local_15c + 1;
      } while( true );
    }
    local_168 = *(long *)(*(long *)(local_10 + 0x10) + (long)local_15c * 8);
    _Var2 = ggml_is_view_op(*(ggml_op *)(local_168 + 0x50));
    if (!_Var2) {
      lVar12 = *(long *)(local_8 + 0x128);
      sVar5 = ggml_hash_find_or_insert((ggml_hash_set *)src_00,key);
      *local_158 = *(int *)(lVar12 + sVar5 * 4);
      goto LAB_0016096c;
    }
    local_15c = local_15c + 1;
  } while( true );
}

Assistant:

static void ggml_backend_sched_split_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    // reset splits
    sched->n_splits = 0;
    sched->n_graph_inputs = 0;
    sched->is_reset = false;

    struct ggml_init_params params = {
        /* .mem_size =   */ sched->context_buffer_size,
        /* .mem_buffer = */ sched->context_buffer,
        /* .no_alloc =   */ true
    };

    ggml_free(sched->ctx);

    sched->ctx = ggml_init(params);
    if (sched->ctx == NULL) {
        GGML_ABORT("%s: failed to initialize context\n", __func__);
    }

    // pass 1: assign backends to ops with pre-allocated inputs
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        int * leaf_backend_id = &tensor_backend_id(leaf);
        // do not overwrite user assignments
        if (*leaf_backend_id == -1) {
            *leaf_backend_id = ggml_backend_sched_backend_id_from_cur(sched, leaf);
        }
    }

    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * node_backend_id = &tensor_backend_id(node);
        // do not overwrite user assignments
        if (*node_backend_id == -1) {
            *node_backend_id = ggml_backend_sched_backend_id_from_cur(sched, node);

#if 0
            // src
            if (node->op == GGML_OP_NONE) {
                continue;
            }

            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }
                int * src_backend_id = &tensor_backend_id(src);
                if (*src_backend_id == -1) {
                    *src_backend_id = ggml_backend_sched_backend_id_from_cur(sched, src);
                }
            }
#endif
        }
    }

    // pass 2: expand current backend assignments
    // assign the same backend to adjacent nodes
    // expand gpu backends (i.e. non last prio) up and down, ignoring cpu (the lowest priority backend)
    // thus, cpu will never be used unless weights are on cpu, or there are no gpu ops between cpu ops
    // ops unsupported by the backend being expanded will be left unassigned so that they can be assigned later when the locations of its inputs are known
    // expand gpu down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand gpu up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }

    // pass 3: upgrade nodes to higher prio backends with compatible buffer types
    // if the tensor is already in the same buffer type (*) as another higher priority backend, we should move it there
    // however, we also need to verify that the sources are in compatible buffer types
    // (*) the actual requirement is more relaxed, the buffer type of the backend should be supported by all the users of this tensor further down the graph
    // however, this is slow to verify, so we have a more strict requirement that the buffer type is the same
    // this is not uncommon since multiple backends can use host memory, with the same buffer type (eg. BLAS and CPU)
    // additionally, set remaining unassigned nodes to the backend with the most supported inputs
    // only nodes that could not be assigned during expansion due to the backend not supporting the op should be unassigned at this point
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        if (ggml_is_view_op(node->op)) {
            continue;
        }
        int * node_backend_id = &tensor_backend_id(node);
        if (*node_backend_id == -1) {
            // unassigned node: find the backend with the most supported inputs
            int n_supported_best = -1;
            for (int b = 0; b < sched->n_backends; b++) {
                if (ggml_backend_supports_op(sched->backends[b], node)) {
                    int n_supported = 0;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if ((tensor_backend_id(src) != -1 || tensor_backend_id(src->view_src) != -1) && ggml_backend_sched_buffer_supported(sched, src, b)) {
                            n_supported++;
                        }
                    }
                    if (n_supported > n_supported_best) {
                        n_supported_best = n_supported;
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.best");
                    }
                }
            }
        } else {
            // assigned node: upgrade to higher prio backend if possible
            for (int b = 0; b < *node_backend_id; b++) {
                if (sched->bufts[b] == sched->bufts[*node_backend_id] && ggml_backend_supports_op(sched->backends[b], node)) {
                    bool supported = true;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if (!ggml_backend_sched_buffer_supported(sched, src, b)) {
                            supported = false;
                            break;
                        }
                    }
                    if (supported) {
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.upg");
                        break;
                    }
                }
            }
        }
    }

    // pass 4: assign backends to remaining src from dst and view_src
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * cur_backend_id = &tensor_backend_id(node);
        if (node->view_src != NULL && *cur_backend_id == -1) {
            *cur_backend_id = tensor_backend_id(node->view_src);
            SET_CAUSE(node, "4.vsrc");
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }
            int * src_backend_id = &tensor_backend_id(src);
            if (*src_backend_id == -1) {
                if (src->view_src != NULL) {
                    // views are always on the same backend as the source
                    *src_backend_id = tensor_backend_id(src->view_src);
                    SET_CAUSE(src, "4.vsrc");
                } else {
                    *src_backend_id = *cur_backend_id;
                    SET_CAUSE(src, "4.cur");
                }
            }
        }
    }

    // pass 5: split graph, find tensors that need to be copied
    {
        int i_split = 0;
        struct ggml_backend_sched_split * split = &sched->splits[0];
        // find the backend of the first split, skipping view ops
        int i = 0;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (!ggml_is_view_op(node->op)) {
                split->backend_id = tensor_backend_id(node);
                break;
            }
        }
        split->i_start = 0;
        split->n_inputs = 0;
        int cur_backend_id = split->backend_id;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];

            if (ggml_is_view_op(node->op)) {
                continue;
            }

            const int node_backend_id = tensor_backend_id(node);

            assert(node_backend_id != -1); // all nodes should be assigned by now

            // check if we should start a new split based on the sources of the current node
            bool need_new_split = false;
            if (node_backend_id == cur_backend_id && split->n_inputs > 0) {
                for (int j = 0; j < GGML_MAX_SRC; j++) {
                    struct ggml_tensor * src = node->src[j];
                    if (src == NULL) {
                        continue;
                    }
                    // check if a weight is on a different and incompatible backend
                    // by starting a new split, the memory of the previously offloaded weights can be reused
                    if (src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
                        int src_backend_id = tensor_backend_id(src);
                        if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                            need_new_split = true;
                            break;
                        }
                    }
                    // check if the split has too many inputs
                    // FIXME: count the number of inputs instead of only checking when full
                    if (split->n_inputs == GGML_SCHED_MAX_SPLIT_INPUTS) {
                        const size_t id = hash_id(src);
                        int src_backend_id = sched->hv_tensor_backend_ids[id];
                        bool supported = ggml_backend_sched_buffer_supported(sched, src, cur_backend_id);
                        if (src_backend_id != cur_backend_id && tensor_id_copy(id, cur_backend_id, 0) == NULL && !supported) {
                            need_new_split = true;
                            break;
                        }
                    }
                }
            }

            if (node_backend_id != cur_backend_id || need_new_split) {
                split->i_end = i;
                i_split++;
                if (i_split >= sched->splits_capacity) {
                    sched->splits_capacity *= 2;
                    sched->splits = (ggml_backend_sched_split *)
                        realloc(sched->splits, sched->splits_capacity * sizeof(struct ggml_backend_sched_split));
                    GGML_ASSERT(sched->splits != NULL);
                }
                split = &sched->splits[i_split];
                split->backend_id = node_backend_id;
                split->i_start = i;
                split->n_inputs = 0;
                cur_backend_id = node_backend_id;
            }

            // find inputs that are not on the same backend
            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }

                size_t src_id = hash_id(src);
                const int src_backend_id = sched->hv_tensor_backend_ids[src_id];
                assert(src_backend_id != -1); // all inputs should be assigned by now

                if (src->flags & GGML_TENSOR_FLAG_INPUT && sched->n_copies > 1) {
                    if (tensor_id_copy(src_id, src_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[src_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy;
                            if (c == sched->cur_copy) {
                                tensor_copy = src; // use the original tensor as the current copy
                            } else {
                                tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                                ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            }
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, src_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_graph_inputs = sched->n_graph_inputs++;
                        GGML_ASSERT(n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        sched->graph_inputs[n_graph_inputs] = src;
                    }
                }

                if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                    // create a copy of the input in the split's backend
                    if (tensor_id_copy(src_id, cur_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[cur_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                            ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, cur_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_inputs = split->n_inputs++;
                        GGML_ASSERT(n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        split->inputs[n_inputs] = src;
                    }
                    node->src[j] = tensor_id_copy(src_id, cur_backend_id, sched->cur_copy);
                }
            }
        }
        split->i_end = graph->n_nodes;
        sched->n_splits = i_split + 1;
    }

    if (sched->debug) {
        ggml_backend_sched_print_assignments(sched, graph);
    }

    // swap node_backend_ids and leaf _backend_ids with prevs
    {
        int * tmp = sched->node_backend_ids;
        sched->node_backend_ids = sched->prev_node_backend_ids;
        sched->prev_node_backend_ids = tmp;

        tmp = sched->leaf_backend_ids;
        sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
        sched->prev_leaf_backend_ids = tmp;
    }

    int graph_size = std::max(graph->n_nodes, graph->n_leafs) + sched->n_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2*sched->n_copies;
    if (sched->graph.size < graph_size) {
        sched->graph.size = graph_size;
        sched->graph.nodes = (ggml_tensor **) realloc(sched->graph.nodes, graph_size * sizeof(struct ggml_tensor *));
        sched->graph.leafs = (ggml_tensor **) realloc(sched->graph.leafs, graph_size * sizeof(struct ggml_tensor *));
        GGML_ASSERT(sched->graph.nodes != NULL);
        GGML_ASSERT(sched->graph.leafs != NULL);
    }
    sched->graph.n_nodes = 0;
    sched->graph.n_leafs = 0;

    struct ggml_cgraph * graph_copy = &sched->graph;

    for (int i = 0; i < sched->n_splits; i++) {
        struct ggml_backend_sched_split * split = &sched->splits[i];
        split->graph = ggml_graph_view(graph, split->i_start, split->i_end);

        // add inputs to the graph copy so that they are allocated by ggml-alloc at the start of the split
        for (int j = 0; j < split->n_inputs; j++) {
            assert(graph_copy->size > (graph_copy->n_nodes + 1));

            struct ggml_tensor * input = split->inputs[j];
            const size_t input_id = hash_id(input);
            struct ggml_tensor * input_cpy = tensor_id_copy(input_id, split->backend_id, sched->cur_copy);

            // add a dependency to the input source so that it is not freed before the copy is done
            struct ggml_tensor * input_dep = ggml_view_tensor(sched->ctx, input);
            input_dep->src[0] = input;
            sched->node_backend_ids[graph_copy->n_nodes] = sched->hv_tensor_backend_ids[input_id];
            graph_copy->nodes[graph_copy->n_nodes++] = input_dep;

            // add a dependency to the input copy so that it is allocated at the start of the split
            sched->node_backend_ids[graph_copy->n_nodes] = split->backend_id;
            graph_copy->nodes[graph_copy->n_nodes++] = input_cpy;
        }

        for (int j = split->i_start; j < split->i_end; j++) {
            assert(graph_copy->size > graph_copy->n_nodes);
            sched->node_backend_ids[graph_copy->n_nodes] = tensor_backend_id(graph->nodes[j]);
            graph_copy->nodes[graph_copy->n_nodes++] = graph->nodes[j];
        }
    }

    if (sched->n_copies > 1) {
        // add input copies as leafs so that they are allocated first
        for (int i = 0; i < sched->n_graph_inputs; i++) {
            struct ggml_tensor * input = sched->graph_inputs[i];
            size_t id = hash_id(input);
            int backend_id = tensor_backend_id(input);
            for (int c = 0; c < sched->n_copies; c++) {
                struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                assert(graph_copy->size > graph_copy->n_leafs);
                graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
            }
        }

        for (int i = 0; i < sched->n_splits; i++) {
            struct ggml_backend_sched_split * split = &sched->splits[i];
            int backend_id = split->backend_id;
            for (int j = 0; j < split->n_inputs; j++) {
                struct ggml_tensor * input = split->inputs[j];
                size_t id = hash_id(input);
                for (int c = 0; c < sched->n_copies; c++) {
                    struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                    sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                    assert(graph_copy->size > graph_copy->n_leafs);
                    graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
                }
            }
        }
    }

    // add leafs from the original graph
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        sched->leaf_backend_ids[graph_copy->n_leafs] = tensor_backend_id(leaf);
        assert(graph_copy->size > graph_copy->n_leafs);
        graph_copy->leafs[graph_copy->n_leafs++] = leaf;
    }
}